

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O1

void __thiscall
amrex::SplineDistFcnElement2d::single_spline_cpdist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *mincp,Real *mindist)

{
  ostream *poVar1;
  double dVar2;
  Real RVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  *t = 0.5;
  dVar4 = ((x1 - x0) * 3.0 - (Dx0 + Dx0)) - Dx1;
  dVar5 = ((y1 - y0) * 3.0 - (Dy0 + Dy0)) - Dy1;
  dVar7 = (x0 - x1) + (x0 - x1) + Dx0 + Dx1;
  dVar8 = (y0 - y1) + (y0 - y1) + Dy0 + Dy1;
  dVar10 = dVar7 * 0.5 * 0.5 * 0.5 + dVar4 * 0.5 * 0.5 + Dx0 * 0.5 + x0;
  dVar11 = dVar8 * 0.5 * 0.5 * 0.5 + dVar5 * 0.5 * 0.5 + Dy0 * 0.5 + y0;
  dVar2 = dVar10 - pt.vect[0];
  dVar6 = dVar11 - pt.vect[1];
  dVar2 = dVar2 * dVar2 + dVar6 * dVar6;
  if (dVar2 < 0.0) {
    RVar3 = sqrt(dVar2);
  }
  else {
    RVar3 = SQRT(dVar2);
  }
  *mindist = RVar3;
  dVar2 = *t;
  dVar9 = dVar8 * 3.0 * dVar2 * dVar2 + (dVar5 + dVar5) * dVar2 + Dy0;
  dVar6 = dVar2 * dVar7 * 3.0 * dVar2 + (dVar4 + dVar4) * dVar2 + Dx0;
  dVar10 = dVar10 - pt.vect[0];
  dVar11 = dVar11 - pt.vect[1];
  dVar2 = dVar2 - (dVar10 * dVar6 + dVar11 * dVar9) /
                  (dVar11 * (dVar5 * 2.0 + dVar8 * 6.0 * dVar2) +
                  (dVar4 + dVar4 + dVar7 * 6.0 * dVar2) * dVar10 + dVar6 * dVar6 + dVar9 * dVar9);
  dVar6 = 0.0;
  if ((0.0 <= dVar2) && (dVar6 = dVar2, 1.0 < dVar2)) {
    dVar6 = 1.0;
  }
  *t = dVar6;
  dVar7 = dVar7 * dVar6 * dVar6 * dVar6 + dVar4 * dVar6 * dVar6 + Dx0 * dVar6 + x0;
  dVar5 = dVar8 * dVar6 * dVar6 * dVar6 + dVar5 * dVar6 * dVar6 + Dy0 * dVar6 + y0;
  dVar2 = dVar7 - pt.vect[0];
  dVar4 = dVar5 - pt.vect[1];
  dVar2 = dVar2 * dVar2 + dVar4 * dVar4;
  if (dVar2 < 0.0) {
    RVar3 = sqrt(dVar2);
  }
  else {
    RVar3 = SQRT(dVar2);
  }
  *mindist = RVar3;
  mincp->vect[0] = dVar7;
  mincp->vect[1] = dVar5;
  mincp->vect[2] = 0.0;
  if ((*mindist == 0.0) && (!NAN(*mindist))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"identified minimum distance of 0.0 at t = ",0x2a);
    poVar1 = std::ostream::_M_insert<double>(*t);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; cp = ",7);
    poVar1 = amrex::operator<<(poVar1,mincp);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," for p = ",9);
    poVar1 = amrex::operator<<(poVar1,&pt);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SplineDistFcnElement2d::single_spline_cpdist(amrex::RealVect pt,
                                    amrex::Real x0, amrex::Real x1,
                                    amrex::Real Dx0, amrex::Real Dx1,
                                    amrex::Real y0, amrex::Real y1,
                                    amrex::Real Dy0, amrex::Real Dy1,
                                    amrex::Real& t, amrex::RealVect& mincp,
                                    amrex::Real& mindist) const {
  t = 0.5;

  amrex::RealVect spt, deltapt;
  const int maxIters = 1;

  amrex::Real dxf, d2xf, dyf, d2yf, tnew;

  for (int i=0; i<maxIters; ++i) {
    mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, t, spt);
    dxbydt(t, y0, y1, Dy0, Dy1, dyf, d2yf);
    dxbydt(t, x0, x1, Dx0, Dx1, dxf, d2xf);

    deltapt =  spt - pt;
    tnew = t - (deltapt[0]*dxf + deltapt[1]*dyf) / (
      dxf*dxf + dyf*dyf + deltapt[0]*d2xf + deltapt[1]*d2yf);

    if (tnew < 0.0) {
      tnew = 0.0;
    } else if (tnew > 1.0) {
      tnew = 1.0;
    }
    t = tnew;
  }
  mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, tnew, spt);
  mincp = spt;

  if (mindist == 0.0) {
    std::cout << "identified minimum distance of 0.0 at t = " << t
              << "; cp = " << mincp << " for p = " << pt << std::endl;
  }
  return;
}